

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int evthread_notify_base_default(event_base *base)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  undefined1 local_11;
  int r;
  char buf [1];
  event_base *base_local;
  
  local_11 = 0;
  _r = base;
  sVar2 = write(base->th_notify_fd[1],&local_11,1);
  bVar4 = false;
  if ((int)sVar2 < 0) {
    piVar3 = __errno_location();
    bVar4 = *piVar3 != 0xb;
  }
  iVar1 = 0;
  if (bVar4) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
evthread_notify_base_default(struct event_base *base)
{
	char buf[1];
	int r;
	buf[0] = (char) 0;
#ifdef _WIN32
	r = send(base->th_notify_fd[1], buf, 1, 0);
#else
	r = write(base->th_notify_fd[1], buf, 1);
#endif
	return (r < 0 && ! EVUTIL_ERR_IS_EAGAIN(errno)) ? -1 : 0;
}